

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O0

float read_int(istream *is)

{
  ulong uVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string line;
  float num;
  istream *is_local;
  
  line.field_2._12_4_ = 0;
  std::istream::operator>>((istream *)is,(float *)((long)&line.field_2 + 0xc));
  uVar1 = std::ios::operator!((ios *)(is + *(long *)(*(long *)is + -0x18)));
  if (((uVar1 & 1) != 0) && (uVar1 = std::ios::eof(), (uVar1 & 1) == 0)) {
    std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    std::istream::unget();
    std::__cxx11::string::string((string *)local_38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)local_38);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_68,&local_88,"\' is not a valid number.");
    std::runtime_error::runtime_error(this,(string *)&local_68);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (float)line.field_2._12_4_;
}

Assistant:

float read_int(std::istream& is)
{
	float num{ 0 };
	is >> num;
	if (!is)
	{
		if (!is.eof())
		{
			is.clear();
			is.unget();
			std::string line;
			std::getline(is, line);
			throw std::runtime_error("'" + line + "' is not a valid number.");
		}
	}
	return num;
}